

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::init(CreateContextExtCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar1;
  Library *egl;
  vector<void_*,_std::allocator<void_*>_> local_28;
  CreateContextExtCase *local_10;
  CreateContextExtCase *this_local;
  
  local_10 = this;
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar1 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_display = pvVar1;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  eglu::chooseConfigs(&local_28,egl,this->m_display,&this->m_filter);
  std::vector<void_*,_std::allocator<void_*>_>::operator=(&this->m_configs,&local_28);
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&local_28);
  return extraout_EAX;
}

Assistant:

void CreateContextExtCase::init (void)
{
	m_display	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_configs	= eglu::chooseConfigs(m_eglTestCtx.getLibrary(), m_display, m_filter);
}